

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

bool __thiscall QProcess::waitForFinished(QProcess *this,int msecs)

{
  QProcessPrivate *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  undefined1 local_28 [24];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QProcessPrivate *)(this->super_QIODevice).super_QObject.d_ptr.d;
  if (this_00->processState == '\0') {
LAB_003ccd53:
    bVar1 = false;
  }
  else {
    local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QDeadlineTimer::QDeadlineTimer((QDeadlineTimer *)local_28,(long)msecs,CoarseTimer);
    if (this_00->processState == '\x01') {
      bVar1 = QProcessPrivate::waitForStarted(this_00,(QDeadlineTimer *)local_28);
      if (!bVar1) goto LAB_003ccd53;
    }
    bVar1 = QProcessPrivate::waitForFinished(this_00,(QDeadlineTimer *)local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcess::waitForFinished(int msecs)
{
    Q_D(QProcess);
    if (d->processState == QProcess::NotRunning)
        return false;

    QDeadlineTimer deadline(msecs);
    if (d->processState == QProcess::Starting) {
        bool started = d->waitForStarted(deadline);
        if (!started)
            return false;
    }

    return d->waitForFinished(deadline);
}